

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

string * string_from_abi_cxx11_(llama_context *ctx,vector<int,_std::allocator<int>_> *tokens)

{
  bool bVar1;
  ostream *poVar2;
  undefined8 in_RDX;
  string *in_RDI;
  string detokenized;
  int *token;
  const_iterator __end1;
  const_iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  bool first;
  stringstream buf;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd58;
  ostream *in_stack_fffffffffffffd60;
  ostream *in_stack_fffffffffffffd70;
  ostream *in_stack_fffffffffffffd78;
  string local_250 [32];
  undefined8 local_230;
  undefined8 local_228;
  undefined8 local_220;
  undefined8 local_210;
  undefined8 local_208;
  char *local_200;
  undefined8 local_1f8;
  string local_1f0 [32];
  reference local_1d0;
  int *local_1c8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_1c0;
  undefined8 local_1b8;
  byte local_1ad;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  undefined8 local_18;
  
  local_18 = in_RDX;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(local_190,"[ ");
  local_1ad = 1;
  local_1b8 = local_18;
  local_1c0._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffd58);
  local_1c8 = (int *)std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffd58);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffd60,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffd58);
    if (!bVar1) break;
    local_1d0 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&local_1c0);
    if ((local_1ad & 1) == 0) {
      std::operator<<(local_190,", ");
    }
    else {
      local_1ad = 0;
    }
    common_token_to_piece_abi_cxx11_
              ((llama_context *)in_stack_fffffffffffffd78,
               (llama_token)((ulong)in_stack_fffffffffffffd70 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffd70 >> 0x18,0));
    local_208 = std::__cxx11::string::begin();
    local_210 = std::__cxx11::string::end();
    local_200 = (char *)std::
                        remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,string_from(llama_context_const*,std::vector<int,std::allocator<int>>const&)::__0>
                                  (local_208,local_210);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffd60,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffd58);
    local_228 = std::__cxx11::string::end();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffd60,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffd58);
    local_230 = std::__cxx11::string::erase(local_1f0,local_1f8,local_220);
    in_stack_fffffffffffffd78 = std::operator<<(local_190,"\'");
    in_stack_fffffffffffffd70 = std::operator<<(in_stack_fffffffffffffd78,local_1f0);
    poVar2 = std::operator<<(in_stack_fffffffffffffd70,"\'");
    in_stack_fffffffffffffd60 = std::operator<<(poVar2,":");
    std::__cxx11::to_string((int)((ulong)in_RDI >> 0x20));
    std::operator<<(in_stack_fffffffffffffd60,local_250);
    std::__cxx11::string::~string(local_250);
    std::__cxx11::string::~string(local_1f0);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_1c0);
  }
  std::operator<<(local_190," ]");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

std::string string_from(const struct llama_context * ctx, const std::vector<llama_token> & tokens) {
    std::stringstream buf;

    buf << "[ ";

    bool first = true;
    for (const auto & token : tokens) {
        if (!first) {
            buf << ", ";
        } else {
            first = false;
        }

        auto detokenized = common_token_to_piece(ctx, token);

        detokenized.erase(
            std::remove_if(
                detokenized.begin(),
                detokenized.end(),
                [](const unsigned char c) { return !std::isprint(c); }),
            detokenized.end());

        buf << "'" << detokenized << "'"
            << ":" << std::to_string(token);
    }

    buf << " ]";

    return buf.str();
}